

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O1

void formatFailMessage(char *msg,size_t maxMsgLen,char *failureMsg,char *val1,char *val2,
                      char *actual,char *expected,ComparisonOperation op)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t __maxlen;
  
  iVar2 = approx_wide_len(actual);
  iVar3 = approx_wide_len(actual);
  iVar4 = snprintf(msg,maxMsgLen,"%s\n",failureMsg);
  __maxlen = maxMsgLen - (long)iVar4;
  if (val1 == (char *)0x0 && val2 == (char *)0x0) {
    snprintf(msg + iVar4,__maxlen,"   %s: %s\n   %s: %s",
             (&PTR_anon_var_dwarf_1e5f5c_00171828)[(int)op],actual,
             (&PTR_anon_var_dwarf_1e5f89_00171868)[(int)op],expected);
  }
  else {
    iVar1 = iVar3;
    if (iVar3 < iVar2) {
      iVar1 = iVar2;
    }
    if (val1 == (char *)0x0) {
      val1 = "<null>";
    }
    if (val2 == (char *)0x0) {
      val2 = "<null>";
    }
    snprintf(msg + iVar4,__maxlen,"   %s(%s)%*s %s\n   %s(%s)%*s %s",
             (&PTR_anon_var_dwarf_1e5f5c_00171828)[(int)op],actual,(ulong)((iVar1 - iVar2) + 1),":",
             val1,(&PTR_anon_var_dwarf_1e5f89_00171868)[(int)op],expected,
             (ulong)((iVar1 - iVar3) + 1),":",val2);
  }
  return;
}

Assistant:

static Q_DECL_COLD_FUNCTION
void formatFailMessage(char *msg, size_t maxMsgLen,
                       const char *failureMsg,
                       const char *val1, const char *val2,
                       const char *actual, const char *expected,
                       QTest::ComparisonOperation op)
{
    const auto len1 = approx_wide_len(actual);
    const auto len2 = approx_wide_len(expected);
    const int written = std::snprintf(msg, maxMsgLen, "%s\n", failureMsg);
    msg += written;
    maxMsgLen -= written;

    const auto protect = [](const char *s) { return s ? s : "<null>"; };

    if (val1 || val2) {
        std::snprintf(msg, maxMsgLen, "   %s(%s)%*s %s\n   %s(%s)%*s %s",
                      leftArgNameForOp(op), actual, qMax(len1, len2) - len1 + 1, ":",
                      protect(val1),
                      rightArgNameForOp(op), expected, qMax(len1, len2) - len2 + 1, ":",
                      protect(val2));
    } else {
        // only print variable names if neither value can be represented as a string
        std::snprintf(msg, maxMsgLen, "   %s: %s\n   %s: %s",
                      leftArgNameForOp(op), actual, rightArgNameForOp(op), expected);
    }
}